

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_dependent_join.cpp
# Opt level: O2

bool __thiscall
duckdb::FlattenDependentJoins::MarkSubtreeCorrelated
          (FlattenDependentJoins *this,LogicalOperator *op)

{
  reference_map_t<LogicalOperator,_bool> *this_00;
  pointer puVar1;
  bool bVar2;
  iterator iVar3;
  LogicalCTERef *pLVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  byte bVar7;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *child;
  pointer puVar8;
  key_type local_38;
  
  this_00 = &this->has_correlated_expressions;
  local_38._M_data = op;
  iVar3 = ::std::
          _Hashtable<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,&local_38);
  bVar7 = *(byte *)((long)iVar3.
                          super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_true>
                          ._M_cur + 0x10);
  puVar1 = (op->children).
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (op->children).
                super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1) {
    bVar2 = MarkSubtreeCorrelated
                      (this,(puVar8->
                            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                            )._M_t.
                            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
    bVar7 = bVar7 | bVar2;
  }
  if (op->type == LOGICAL_GET) {
    if ((long)(op->children).
              super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(op->children).
              super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 8) goto LAB_01a8dc05;
  }
  else if (op->type == LOGICAL_CTE_REF) {
    pLVar4 = LogicalOperator::Cast<duckdb::LogicalCTERef>(op);
    iVar5 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LogicalOperator_*>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LogicalOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->binder->recursive_ctes)._M_h,&pLVar4->cte_index);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::LogicalOperator_*>,_false>.
        _M_cur == (__node_type *)0x0) {
      bVar7 = false;
    }
    else {
      bVar7 = *(long *)(*(long *)((long)iVar5.
                                        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::LogicalOperator_*>,_false>
                                        ._M_cur + 0x10) + 0x98) !=
              *(long *)(*(long *)((long)iVar5.
                                        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::LogicalOperator_*>,_false>
                                        ._M_cur + 0x10) + 0xa0);
    }
    local_38._M_data = op;
    pmVar6 = ::std::__detail::
             _Map_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,&local_38);
    *pmVar6 = (mapped_type)bVar7;
    goto LAB_01a8dc05;
  }
  local_38._M_data = op;
  pmVar6 = ::std::__detail::
           _Map_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,&local_38);
  *pmVar6 = (mapped_type)(bVar7 & 1);
LAB_01a8dc05:
  return (bool)(bVar7 & 1);
}

Assistant:

bool FlattenDependentJoins::MarkSubtreeCorrelated(LogicalOperator &op) {
	// Do not mark base table scans as correlated
	auto entry = has_correlated_expressions.find(op);
	D_ASSERT(entry != has_correlated_expressions.end());
	bool has_correlation = entry->second;
	for (auto &child : op.children) {
		has_correlation |= MarkSubtreeCorrelated(*child.get());
	}
	if (op.type != LogicalOperatorType::LOGICAL_GET || op.children.size() == 1) {
		if (op.type == LogicalOperatorType::LOGICAL_CTE_REF) {
			// There may be multiple recursive CTEs. Only mark CTE_REFs as correlated,
			// IFF the CTE that we are reading from is correlated.
			auto &cteref = op.Cast<LogicalCTERef>();
			auto cte = binder.recursive_ctes.find(cteref.cte_index);
			bool has_correlation = false;
			if (cte != binder.recursive_ctes.end()) {
				auto &rec_cte = cte->second->Cast<LogicalCTE>();
				has_correlation = !rec_cte.correlated_columns.empty();
			}
			has_correlated_expressions[op] = has_correlation;
			return has_correlation;
		} else {
			has_correlated_expressions[op] = has_correlation;
		}
	}
	return has_correlation;
}